

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityCosseratSimple::ComputeStiffnessMatrix
          (ChElasticityCosseratSimple *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_n,
          ChVector<double> *strain_m)

{
  Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            (&K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>,6,6);
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0] =
       this->E * this->A;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[7] =
       this->Ks_y * this->G * this->A;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0xe] =
       this->Ks_z * this->G * this->A;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x15] =
       this->G * this->J;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x1c] =
       this->E * this->Iyy;
  (K->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array[0x23] =
       this->E * this->Izz;
  return;
}

Assistant:

void ChElasticityCosseratSimple::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                        const ChVector<>& strain_n,
                                                        const ChVector<>& strain_m) {
    K.setZero(6, 6);
    K(0, 0) = E * A;
    K(1, 1) = Ks_y * G * A;
    K(2, 2) = Ks_z * G * A;
    K(3, 3) = G * J;
    K(4, 4) = E * Iyy;
    K(5, 5) = E * Izz;
}